

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.hpp
# Opt level: O3

int __thiscall
skiplist<DictKey,_std::less<DictKey>_>::count
          (skiplist<DictKey,_std::less<DictKey>_> *this,DictKey *value)

{
  pointer pcVar1;
  int iVar2;
  iterator it;
  undefined1 local_50 [8];
  _Alloc_hider local_48;
  char local_38 [16];
  iterator local_28;
  
  local_50._0_4_ = value->key_;
  pcVar1 = (value->value_)._M_dataplus._M_p;
  local_48._M_p = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + (value->value_)._M_string_length);
  find(&local_28,this,(DictKey *)local_50);
  if (local_48._M_p != local_38) {
    operator_delete(local_48._M_p);
  }
  if ((local_28.node != (SLNode<DictKey> *)0x0) || (iVar2 = 0, local_28.node_count_ != 0)) {
    iVar2 = (local_28.node)->count;
  }
  return iVar2;
}

Assistant:

int count(val_type value) {
        auto it = find(value);
        return  it != end() ? it.node->count : 0;
    }